

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
::visit_string(basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
               *this,string_view_type *sv,semantic_tag tag,ser_context *param_4,error_code *param_5)

{
  bool bVar1;
  bignum_format_kind bVar2;
  reference pvVar3;
  size_t sVar4;
  char in_DL;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *in_RSI;
  long in_RDI;
  string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *in_stack_00000078;
  bool in_stack_00000086;
  bool in_stack_00000087;
  size_t in_stack_00000088;
  wchar_t *in_stack_00000090;
  string_view_type *in_stack_00000168;
  basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>
  *in_stack_00000170;
  value_type in_stack_ffffffffffffffac;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
  *in_stack_ffffffffffffffc0;
  
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
          ::empty(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    bVar1 = encoding_context::is_array(pvVar3);
    if (bVar1) {
      pvVar3 = std::
               vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
               ::back((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                       *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
      sVar4 = encoding_context::count(pvVar3);
      if (sVar4 != 0) {
        string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
        ::push_back((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                    in_stack_ffffffffffffffac);
      }
    }
  }
  if (in_DL == '\x02') {
    write_bigint_value(in_stack_00000170,in_stack_00000168);
  }
  else if ((in_DL == '\x03') &&
          (bVar2 = basic_json_encode_options<wchar_t>::bignum_format
                             ((basic_json_encode_options<wchar_t> *)(in_RDI + 0x10)),
          bVar2 == number)) {
    write_bigint_value(in_stack_00000170,in_stack_00000168);
  }
  else {
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::data(in_RSI);
    in_stack_ffffffffffffffc0 =
         (vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
          *)std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::length(in_RSI);
    in_stack_ffffffffffffffb7 =
         basic_json_encode_options<wchar_t>::escape_all_non_ascii
                   ((basic_json_encode_options<wchar_t> *)(in_RDI + 0x10));
    basic_json_encode_options<wchar_t>::escape_solidus
              ((basic_json_encode_options<wchar_t> *)(in_RDI + 0x10));
    detail::escape_string<wchar_t,jsoncons::string_sink<std::__cxx11::wstring>>
              (in_stack_00000090,in_stack_00000088,in_stack_00000087,in_stack_00000086,
               in_stack_00000078);
    string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
    ::push_back((string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                 *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                in_stack_ffffffffffffffac);
  }
  bVar1 = std::
          vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
          ::empty(in_stack_ffffffffffffffc0);
  if (!bVar1) {
    pvVar3 = std::
             vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_compact_json_encoder<wchar_t,_jsoncons::string_sink<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<char>_>::encoding_context>_>
                     *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
    encoding_context::increment_count(pvVar3);
  }
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code&) final
        {
            if (!stack_.empty() && stack_.back().is_array() && stack_.back().count() > 0)
            {
                sink_.push_back(',');
            }

            switch (tag)
            {
                case semantic_tag::bigint:
                    write_bigint_value(sv);
                    break;
                case semantic_tag::bigdec:
                {
                    // output lossless number
                    if (options_.bignum_format() == bignum_format_kind::raw)
                    {
                        write_bigint_value(sv);
                        break;
                    }
                    JSONCONS_FALLTHROUGH;
                }
                default:
                {
                    sink_.push_back('\"');
                    jsoncons::detail::escape_string(sv.data(), sv.length(),options_.escape_all_non_ascii(),options_.escape_solidus(),sink_);
                    sink_.push_back('\"');
                    break;
                }
            }

            if (!stack_.empty())
            {
                stack_.back().increment_count();
            }
            JSONCONS_VISITOR_RETURN;
        }